

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_TestVectorScatterGather_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_TestVectorScatterGather_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::KnownAEAD>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_006ce2b8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__PerAEADTest_TestVectorScatterGather_Test_006ce2f8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }